

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_encoder_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::LabelEncoderTest_unicode_Test::TestBody
          (LabelEncoderTest_unicode_Test *this)

{
  Label *label;
  char *message;
  AssertionResult gtest_ar;
  char unicodeText [19];
  internal local_98 [8];
  undefined8 *local_90;
  string local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char local_28 [32];
  
  builtin_strncpy(local_28,"Προμηθεύς",0x13);
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[19],_true>
            (&local_68,(char (*) [5])0x13c7aa,(char (*) [19])local_28);
  LabelEncoderTest::Encode(&local_88,(LabelEncoderTest *)&local_68,label);
  testing::internal::CmpHelperEQ<char[38],std::__cxx11::string>
            (local_98,"\"/name@base64/zqDPgc6_zrzOt864zrXPjc-C\"",
             "Encode(Label{\"name\", unicodeText})",
             (char (*) [38])"/name@base64/zqDPgc6_zrzOt864zrXPjc-C",&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.second._M_dataplus._M_p != &local_68.second.field_2) {
    operator_delete(local_68.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
    operator_delete(local_68.first._M_dataplus._M_p);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_90 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_90;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/tests/internal/label_encoder_test.cc"
               ,0x27,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_68.first._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_68.first._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_90 != local_90 + 2) {
      operator_delete((undefined8 *)*local_90);
    }
    operator_delete(local_90);
  }
  return;
}

Assistant:

TEST_F(LabelEncoderTest, unicode) {
  const char unicodeText[] =
      "\xce\xa0\xcf\x81\xce\xbf\xce\xbc\xce\xb7\xce\xb8\xce\xb5\xcf\x8d\xcf"
      "\x82";  // Προμηθεύς
  EXPECT_EQ("/name@base64/zqDPgc6_zrzOt864zrXPjc-C",
            Encode(Label{"name", unicodeText}));
}